

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall
DnsStats::SubmitOPTRecord
          (DnsStats *this,uint32_t flags,uint8_t *content,uint32_t length,uint32_t *e_rcode)

{
  ulong uVar1;
  uint uVar2;
  uint32_t o_length;
  uint32_t o_code;
  uint32_t current_index;
  uint32_t *e_rcode_local;
  uint32_t length_local;
  uint8_t *content_local;
  uint32_t flags_local;
  DnsStats *this_local;
  
  o_length = 0;
  RegisterEdnsUsage(this,flags,e_rcode);
  if (length == 0) {
    this->edns_options = (uint8_t *)0x0;
    this->edns_options_length = 0;
  }
  else {
    this->edns_options = content;
    this->edns_options_length = length;
  }
  while (o_length + 4 <= length) {
    uVar1 = (ulong)o_length;
    uVar2 = o_length + 1;
    o_length = CONCAT11(content[o_length + 2],content[o_length + 3]) + 4 + o_length;
    SubmitRegistryNumber(this,8,(uint)CONCAT11(content[uVar1],content[uVar2]));
  }
  return;
}

Assistant:

void DnsStats::SubmitOPTRecord(uint32_t flags, uint8_t * content, uint32_t length, uint32_t * e_rcode)
{
    uint32_t current_index = 0;

    RegisterEdnsUsage(flags, e_rcode);

    if (current_index < length) {
        edns_options = &content[current_index];
        edns_options_length = length - current_index;
    }
    else {
        edns_options = NULL;
        edns_options_length = 0;
    }

    /* Find the options in the payload */
    while (current_index + 4 <= length)
    {
        uint32_t o_code = (content[current_index] << 8) | content[current_index + 1];
        uint32_t o_length = (content[current_index+2] << 8) | content[current_index + 3];
        current_index += 4 + o_length;
        SubmitRegistryNumber(REGISTRY_EDNS_OPT_CODE, o_code);
    }
}